

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void rmadd_stride(double *A,double *B,double *C,int rows,int cols,int p,int sA,int sB,int sC)

{
  int rows_00;
  int cols_00;
  int p_00;
  int w;
  int v;
  int u;
  int j;
  int i;
  int p_local;
  int cols_local;
  int rows_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  if (rows + cols + p < 0xc1) {
    for (u = 0; u < rows; u = u + 1) {
      for (v = 0; v < cols; v = v + 1) {
        C[v + u * sC] = A[v + u * sA] + B[v + u * sB];
      }
    }
  }
  else {
    rows_00 = rows / 2;
    cols_00 = cols / 2;
    p_00 = p / 2;
    rmadd_stride(A,B,C,rows_00,cols_00,p_00,sA,sB,sC);
    rmadd_stride(A + cols_00,B + cols_00,C + cols_00,rows_00,cols_00,p_00,sA,sB,sC);
    rmadd_stride(A + rows_00 * sB,B + rows_00 * sC,C + rows_00 * sC,rows_00,cols_00,p_00,sA,sB,sC);
    rmadd_stride(A + (long)(rows_00 * sB) + (long)cols_00,B + (long)(rows_00 * sC) + (long)cols_00,
                 C + (long)(rows_00 * sC) + (long)cols_00,rows_00,cols_00,p_00,sA,sB,sC);
  }
  return;
}

Assistant:

void rmadd_stride(double* A, double* B, double* C,int rows,int cols,int p,int sA,int sB,int sC) {
	int i,j,u,v,w;
	if (rows + cols + p <= CUTOFF) {
		for (i = 0; i < rows; ++i) {
			u = i * sC;
			v = i * sA;
			w = i * sB;
			for(j = 0; j < cols;j++) {
				C[j + u] = A[j + v] + B[j + w];
			}
		}
		
	 } else {
		 rows/=2;cols/=2;p/=2;
		 rmadd_stride(A,B,C,rows,cols,p,sA,sB,sC);
		 rmadd_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
		 rmadd_stride(A + rows *sB,B + rows *sC,C + rows *sC,rows,cols,p,sA,sB,sC);
		 rmadd_stride(A + rows *sB + cols,B + rows *sC + cols,C + rows *sC + cols,rows,cols,p,sA,sB,sC);
	 }
}